

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O3

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::skip_multi_line_comment
          (lexical_analyzer_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  char_t cVar2;
  char_t cVar3;
  
  bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream);
  if (!bVar1) {
    cVar2 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
    bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream);
    if ((!bVar1) &&
       ((cVar3 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream),
        cVar2 != const_t<cfgfile::string_trait_t>::c_sharp ||
        (cVar3 != const_t<cfgfile::string_trait_t>::c_vertical_bar)))) {
      do {
        bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream);
        if (bVar1) {
          return;
        }
        cVar2 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
        bVar1 = cVar3 != const_t<cfgfile::string_trait_t>::c_sharp;
        cVar3 = cVar2;
      } while ((bVar1) || (cVar2 != const_t<cfgfile::string_trait_t>::c_vertical_bar));
    }
  }
  return;
}

Assistant:

void skip_multi_line_comment()
	{
		if( !m_stream.at_end() )
		{
			typename Trait::char_t ch = m_stream.get();

			if( m_stream.at_end() )
				return;

			typename Trait::char_t next_char = m_stream.get();

			if( ch == const_t< Trait >::c_sharp &&
				next_char == const_t< Trait >::c_vertical_bar )
					return;

			while( !m_stream.at_end() )
			{
				ch = next_char;

				next_char = m_stream.get();

				if( ch == const_t< Trait >::c_sharp &&
					next_char == const_t< Trait >::c_vertical_bar )
						break;
			}
		}
	}